

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O2

int duckdb_hll::hllSparseSet(robj *o,long index,uint8_t count)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  sds s;
  size_t sVar4;
  byte bVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  long lVar11;
  byte *pbVar12;
  long lVar13;
  byte *__dest;
  size_t __n;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint8_t seq [5];
  
  if (0x20 < count) goto LAB_01ee40b1;
  s = sdsMakeRoomFor((sds)o->ptr,3);
  o->ptr = s;
  sVar4 = sdslen(s);
  pbVar8 = (byte *)(s + sVar4);
  lVar7 = 0;
  pbVar14 = (byte *)(s + 0x11);
  lVar13 = 0;
  pbVar15 = pbVar14;
  pbVar16 = (byte *)0x0;
  while (__dest = pbVar15, iVar3 = (int)lVar7, __dest < pbVar8) {
    bVar1 = *__dest;
    uVar6 = (uint)bVar1;
    lVar11 = 1;
    if (0x3f < bVar1) {
      if ((char)bVar1 < '\0') {
        uVar6 = bVar1 & 3;
      }
      else {
        uVar6 = (bVar1 & 0x3f) << 8 | (uint)__dest[1];
        lVar11 = 2;
      }
    }
    lVar10 = lVar13 + (ulong)uVar6 + 1;
    lVar7 = (ulong)uVar6 + 1;
    iVar3 = (int)lVar7;
    if (index < lVar10) goto LAB_01ee417b;
    lVar13 = lVar10;
    pbVar16 = __dest;
    pbVar15 = __dest + lVar11;
  }
  if (lVar7 == 0) {
    return -1;
  }
LAB_01ee417b:
  bVar1 = *__dest;
  pbVar12 = __dest + (ulong)((bVar1 & 0xc0) == 0x40) + 1;
  pbVar15 = (byte *)0x0;
  if (pbVar12 < pbVar8) {
    pbVar15 = pbVar12;
  }
  if ((bVar1 & 0xc0) == 0) {
    if (bVar1 == 0) {
LAB_01ee422d:
      *__dest = count * '\x04' + 0x7c | 0x80;
      goto LAB_01ee43b0;
    }
LAB_01ee41ef:
    iVar3 = iVar3 + (int)lVar13 + -1;
    lVar13 = index - lVar13;
    if (lVar13 == 0) {
      pbVar9 = seq;
    }
    else if ((int)lVar13 < 0x41) {
      seq[0] = (char)lVar13 + 0xff;
      pbVar9 = seq + 1;
    }
    else {
      iVar2 = (int)lVar13 + -1;
      seq[0] = (byte)((uint)iVar2 >> 8) | 0x40;
      pbVar9 = seq + 2;
      seq[1] = (uint8_t)iVar2;
    }
    *pbVar9 = count * '\x04' + 0x7c | 0x80;
    iVar2 = (int)pbVar9;
    if (iVar3 == index) {
      iVar3 = (iVar2 + 1) - (int)seq;
    }
    else {
      iVar3 = iVar3 - (int)index;
      if (iVar3 < 0x41) {
        pbVar9[1] = (char)iVar3 - 1;
        iVar3 = (iVar2 - (int)seq) + 2;
      }
      else {
        pbVar9[1] = (byte)((uint)(iVar3 + -1) >> 8) | 0x40;
        pbVar9[2] = (byte)(iVar3 + -1);
        iVar3 = (iVar2 - (int)seq) + 3;
      }
    }
    if ((bVar1 & 0xc0) == 0) goto LAB_01ee431e;
    iVar2 = -2;
  }
  else {
    if ((bVar1 & 0xc0) == 0x40) goto LAB_01ee41ef;
    bVar5 = bVar1 >> 2 & 0x1f;
    if (count <= (byte)(bVar5 + 1)) {
      return 0;
    }
    if ((bVar1 & 3) == 0) goto LAB_01ee422d;
    iVar3 = iVar3 + (int)lVar13 + -1;
    if (index == lVar13) {
      pbVar9 = seq;
    }
    else {
      seq[0] = ((byte)index - (char)lVar13) - 1 | bVar5 * '\x04' | 0x80;
      pbVar9 = seq + 1;
    }
    *pbVar9 = count * '\x04' + 0x7c | 0x80;
    if (iVar3 == index) {
      iVar3 = (int)pbVar9 + 1;
    }
    else {
      pbVar9[1] = (char)iVar3 + ~(byte)index | bVar5 << 2 | 0x80;
      iVar3 = (int)pbVar9 + 2;
    }
    iVar3 = iVar3 - (int)seq;
LAB_01ee431e:
    iVar2 = -1;
  }
  uVar6 = iVar3 + iVar2;
  if ((0 < (int)uVar6) && (sVar4 = sdslen(s), 3000 < uVar6 + sVar4)) {
LAB_01ee40b1:
    iVar2 = hllSparseToDense(o);
    iVar3 = -1;
    if (iVar2 != -1) {
      iVar3 = hllDenseSet((uint8_t *)((long)o->ptr + 0x11),index,count);
    }
    return iVar3;
  }
  lVar13 = (long)(int)uVar6;
  if ((uVar6 != 0) && (pbVar12 < pbVar8)) {
    memmove(pbVar15 + lVar13,pbVar15,(long)pbVar8 - (long)pbVar15);
    s = (sds)o->ptr;
  }
  sdsIncrLen(s,lVar13);
  switchD_01939fa4::default(__dest,seq,(long)iVar3);
  pbVar8 = pbVar8 + lVar13;
LAB_01ee43b0:
  if (pbVar16 != (byte *)0x0) {
    pbVar14 = pbVar16;
  }
  iVar3 = 5;
  do {
    pbVar15 = pbVar14 + 1;
    iVar3 = -iVar3;
    __n = (long)pbVar8 - (long)pbVar14;
    while( true ) {
      iVar3 = iVar3 + 1;
      if ((pbVar8 <= pbVar14) || (iVar3 == 1)) {
        pbVar14 = (byte *)((long)o->ptr + 0xf);
        *pbVar14 = *pbVar14 | 0x80;
        return 1;
      }
      bVar1 = *pbVar14;
      if ((bVar1 & 0xc0) == 0) goto LAB_01ee445d;
      if ((bVar1 & 0xc0) == 0x40) break;
      if ((((pbVar8 <= pbVar15) || (bVar5 = *pbVar15, -1 < (char)bVar5)) ||
          (((bVar5 ^ bVar1) & 0x7c) != 0)) || (bVar5 = (bVar5 & 3) + (bVar1 & 3), 2 < bVar5))
      goto LAB_01ee445d;
      pbVar14[1] = bVar5 + 1 | bVar1 & 0x7c | 0x80;
      memmove(pbVar14,pbVar15,__n);
      sdsIncrLen((sds)o->ptr,-1);
      pbVar8 = pbVar8 + -1;
      __n = __n - 1;
    }
    pbVar15 = pbVar14 + 2;
LAB_01ee445d:
    iVar3 = -iVar3;
    pbVar14 = pbVar15;
  } while( true );
}

Assistant:

int hllSparseSet(robj *o, long index, uint8_t count) {
    struct hllhdr *hdr;
    uint8_t oldcount, *sparse, *end, *p, *prev, *next;
    long first, span;
    long is_zero = 0, is_xzero = 0, is_val = 0, runlen = 0;
    uint8_t seq[5], *n;
    int last;
    int len;
    int seqlen;
    int oldlen;
    int deltalen;

    /* If the count is too big to be representable by the sparse representation
     * switch to dense representation. */
    if (count > HLL_SPARSE_VAL_MAX_VALUE) goto promote;

    /* When updating a sparse representation, sometimes we may need to
     * enlarge the buffer for up to 3 bytes in the worst case (XZERO split
     * into XZERO-VAL-XZERO). Make sure there is enough space right now
     * so that the pointers we take during the execution of the function
     * will be valid all the time. */
    o->ptr = (sds) sdsMakeRoomFor((sds) o->ptr,3);

    /* Step 1: we need to locate the opcode we need to modify to check
     * if a value update is actually needed. */
    sparse = p = ((uint8_t*)o->ptr) + HLL_HDR_SIZE;
    end = p + sdslen((sds) o->ptr) - HLL_HDR_SIZE;

    first = 0;
    prev = NULL; /* Points to previous opcode at the end of the loop. */
    next = NULL; /* Points to the next opcode at the end of the loop. */
    span = 0;
    while(p < end) {
        long oplen;

        /* Set span to the number of registers covered by this opcode.
         *
         * This is the most performance critical loop of the sparse
         * representation. Sorting the conditionals from the most to the
         * least frequent opcode in many-bytes sparse HLLs is faster. */
        oplen = 1;
        if (HLL_SPARSE_IS_ZERO(p)) {
            span = HLL_SPARSE_ZERO_LEN(p);
        } else if (HLL_SPARSE_IS_VAL(p)) {
            span = HLL_SPARSE_VAL_LEN(p);
        } else { /* XZERO. */
            span = HLL_SPARSE_XZERO_LEN(p);
            oplen = 2;
        }
        /* Break if this opcode covers the register as 'index'. */
        if (index <= first+span-1) break;
        prev = p;
        p += oplen;
        first += span;
    }
    if (span == 0) return -1; /* Invalid format. */

    next = HLL_SPARSE_IS_XZERO(p) ? p+2 : p+1;
    if (next >= end) next = NULL;

    /* Cache current opcode type to avoid using the macro again and
     * again for something that will not change.
     * Also cache the run-length of the opcode. */
    if (HLL_SPARSE_IS_ZERO(p)) {
        is_zero = 1;
        runlen = HLL_SPARSE_ZERO_LEN(p);
    } else if (HLL_SPARSE_IS_XZERO(p)) {
        is_xzero = 1;
        runlen = HLL_SPARSE_XZERO_LEN(p);
    } else {
        is_val = 1;
        runlen = HLL_SPARSE_VAL_LEN(p);
    }

    /* Step 2: After the loop:
     *
     * 'first' stores to the index of the first register covered
     *  by the current opcode, which is pointed by 'p'.
     *
     * 'next' ad 'prev' store respectively the next and previous opcode,
     *  or NULL if the opcode at 'p' is respectively the last or first.
     *
     * 'span' is set to the number of registers covered by the current
     *  opcode.
     *
     * There are different cases in order to update the data structure
     * in place without generating it from scratch:
     *
     * A) If it is a VAL opcode already set to a value >= our 'count'
     *    no update is needed, regardless of the VAL run-length field.
     *    In this case PFADD returns 0 since no changes are performed.
     *
     * B) If it is a VAL opcode with len = 1 (representing only our
     *    register) and the value is less than 'count', we just update it
     *    since this is a trivial case. */
    if (is_val) {
        oldcount = HLL_SPARSE_VAL_VALUE(p);
        /* Case A. */
        if (oldcount >= count) return 0;

        /* Case B. */
        if (runlen == 1) {
            HLL_SPARSE_VAL_SET(p,count,1);
            goto updated;
        }
    }

    /* C) Another trivial to handle case is a ZERO opcode with a len of 1.
     * We can just replace it with a VAL opcode with our value and len of 1. */
    if (is_zero && runlen == 1) {
        HLL_SPARSE_VAL_SET(p,count,1);
        goto updated;
    }

    /* D) General case.
     *
     * The other cases are more complex: our register requires to be updated
     * and is either currently represented by a VAL opcode with len > 1,
     * by a ZERO opcode with len > 1, or by an XZERO opcode.
     *
     * In those cases the original opcode must be split into multiple
     * opcodes. The worst case is an XZERO split in the middle resuling into
     * XZERO - VAL - XZERO, so the resulting sequence max length is
     * 5 bytes.
     *
     * We perform the split writing the new sequence into the 'new' buffer
     * with 'newlen' as length. Later the new sequence is inserted in place
     * of the old one, possibly moving what is on the right a few bytes
     * if the new sequence is longer than the older one. */
    n = seq;
    last = first+span-1; /* Last register covered by the sequence. */

    if (is_zero || is_xzero) {
        /* Handle splitting of ZERO / XZERO. */
        if (index != first) {
            len = index-first;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            if (len > HLL_SPARSE_ZERO_MAX_LEN) {
                HLL_SPARSE_XZERO_SET(n,len);
                n += 2;
            } else {
                HLL_SPARSE_ZERO_SET(n,len);
                n++;
            }
        }
    } else {
        /* Handle splitting of VAL. */
        int curval = HLL_SPARSE_VAL_VALUE(p);

        if (index != first) {
            len = index-first;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
        HLL_SPARSE_VAL_SET(n,count,1);
        n++;
        if (index != last) {
            len = last-index;
            HLL_SPARSE_VAL_SET(n,curval,len);
            n++;
        }
    }

    /* Step 3: substitute the new sequence with the old one.
     *
     * Note that we already allocated space on the sds string
     * calling sdsMakeRoomFor(). */
     seqlen = n-seq;
     oldlen = is_xzero ? 2 : 1;
     deltalen = seqlen-oldlen;

     if (deltalen > 0 &&
         sdslen((sds) o->ptr)+deltalen > HLL_SPARSE_MAX_BYTES) goto promote;
     if (deltalen && next) memmove(next+deltalen,next,end-next);
     sdsIncrLen((sds) o->ptr,deltalen);
     memcpy(p,seq,seqlen);
     end += deltalen;

updated: {
    /* Step 4: Merge adjacent values if possible.
     *
     * The representation was updated, however the resulting representation
     * may not be optimal: adjacent VAL opcodes can sometimes be merged into
     * a single one. */
    p = prev ? prev : sparse;
    int scanlen = 5; /* Scan up to 5 upcodes starting from prev. */
    while (p < end && scanlen--) {
        if (HLL_SPARSE_IS_XZERO(p)) {
            p += 2;
            continue;
        } else if (HLL_SPARSE_IS_ZERO(p)) {
            p++;
            continue;
        }
        /* We need two adjacent VAL opcodes to try a merge, having
         * the same value, and a len that fits the VAL opcode max len. */
        if (p+1 < end && HLL_SPARSE_IS_VAL(p+1)) {
            int v1 = HLL_SPARSE_VAL_VALUE(p);
            int v2 = HLL_SPARSE_VAL_VALUE(p+1);
            if (v1 == v2) {
                int len = HLL_SPARSE_VAL_LEN(p)+HLL_SPARSE_VAL_LEN(p+1);
                if (len <= HLL_SPARSE_VAL_MAX_LEN) {
                    HLL_SPARSE_VAL_SET(p+1,v1,len);
                    memmove(p,p+1,end-p);
                    sdsIncrLen((sds) o->ptr,-1);
                    end--;
                    /* After a merge we reiterate without incrementing 'p'
                     * in order to try to merge the just merged value with
                     * a value on its right. */
                    continue;
                }
            }
        }
        p++;
    }

    /* Invalidate the cached cardinality. */
    hdr = (struct hllhdr *) o->ptr;
    HLL_INVALIDATE_CACHE(hdr);
    return 1;
}
promote: /* Promote to dense representation. */
    if (hllSparseToDense(o) == HLL_C_ERR) return -1; /* Corrupted HLL. */
    hdr = (struct hllhdr *) o->ptr;

    /* We need to call hllDenseAdd() to perform the operation after the
     * conversion. However the result must be 1, since if we need to
     * convert from sparse to dense a register requires to be updated.
     *
     * Note that this in turn means that PFADD will make sure the command
     * is propagated to slaves / AOF, so if there is a sparse -> dense
     * conversion, it will be performed in all the slaves as well. */
    int dense_retval = hllDenseSet(hdr->registers + 1,index,count);
    assert(dense_retval == 1);
    return dense_retval;
}